

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageDataOperations.h
# Opt level: O2

void __thiscall
fe::operations::op_blend_subtract::operator()
          (op_blend_subtract *this,PixelDISTANCE *srcPixelFormat,PixelDISTANCE *destPixelFormat,
          uchar *srcData,uchar *destData,int x,int y)

{
  uchar uVar1;
  undefined8 in_RAX;
  Pixel pS;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  PixelDISTANCE::getPixel(srcPixelFormat,srcData,(Pixel *)((long)&uStack_38 + 4),x,y);
  PixelDISTANCE::getPixel(destPixelFormat,destData,(Pixel *)&uStack_38,x,y);
  uVar1 = '\0';
  if (0 < (int)((uint)(byte)uStack_38._3_1_ - (uint)uStack_38._7_1_)) {
    uVar1 = (uchar)((uint)(byte)uStack_38._3_1_ - (uint)uStack_38._7_1_);
  }
  *destData = uVar1;
  return;
}

Assistant:

void operator()(const Src& srcPixelFormat, Dest& destPixelFormat, const unsigned char* srcData, unsigned char* destData, OPERATOR_ARGS) const
            {
                Pixel pS;
                srcPixelFormat.getPixel(srcData, pS, OPERATOR_ARGS_PASS);

                Pixel pD;
                destPixelFormat.getPixel(destData, pD, OPERATOR_ARGS_PASS);

                float k = pS.a / float(pD.a);
                pD.r = std::max(0, int(pD.r - pD.r * k));
                pD.g = std::max(0, int(pD.g - pD.g * k));
                pD.b = std::max(0, int(pD.b - pD.b * k));
                pD.a = std::max(0, int(pD.a - pS.a));

                destPixelFormat.setPixel(destData, pD);
            }